

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

ssize_t ws_enc_write_head(Curl_easy *data,ws_encoder *enc,uint flags,curl_off_t payload_len,
                         bufq *out,CURLcode *err)

{
  curl_trc_feat *pcVar1;
  uint uVar2;
  CURLcode CVar3;
  byte *pbVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 uVar7;
  size_t len;
  char *pcVar8;
  byte bVar9;
  byte *pbVar10;
  byte local_3e [10];
  byte local_34 [4];
  
  if (payload_len < 0) {
    pcVar8 = "WS: starting new frame with negative payload length %ld";
LAB_00168494:
    Curl_failf(data,pcVar8,payload_len);
    goto LAB_0016849b;
  }
  if (0 < enc->payload_remain) {
    pcVar8 = "WS: starting new frame with %zd bytes from last one remaining to be sent";
    payload_len = enc->payload_remain;
    goto LAB_00168494;
  }
  uVar2 = flags & 0xffffffdf;
  if (0x14 < uVar2) {
    if (uVar2 == 0x40) {
      bVar9 = 0x8a;
      goto LAB_00168611;
    }
    if (uVar2 != 0x44) goto switchD_001684dd_caseD_3;
    pcVar8 = "WS: PONG frame must not be fragmented";
    goto LAB_00168588;
  }
  bVar9 = enc->field_0x19 & 1;
  switch(uVar2) {
  case 0:
    if (bVar9 != 0) {
      bVar9 = 0x80;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        pcVar8 = "WS: no flags given; interpreting as continuation fragment for compatibility";
LAB_001685ff:
        Curl_infof(data,pcVar8);
      }
      break;
    }
    pcVar8 = "WS: no flags given";
    goto LAB_00168588;
  case 1:
    bVar9 = bVar9 ^ 0x81;
    break;
  case 2:
    bVar9 = (bVar9 == 0) * '\x02' | 0x80;
    break;
  default:
switchD_001684dd_caseD_3:
    Curl_failf(data,"WS: unknown flags: %x",(ulong)flags);
    CVar3 = CURLE_SEND_ERROR;
    goto LAB_00168597;
  case 4:
    if (bVar9 != 0) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        pcVar8 = 
        "WS: setting CURLWS_CONT flag without message type is supported for compatibility but highly discouraged"
        ;
        bVar9 = 0;
        goto LAB_001685ff;
      }
      bVar9 = 0;
      break;
    }
    pcVar8 = "WS: No ongoing fragmented message to continue";
    goto LAB_00168588;
  case 5:
    bVar9 = bVar9 ^ 1;
    break;
  case 6:
    bVar9 = bVar9 * '\x02' ^ 2;
    break;
  case 8:
    bVar9 = 0x88;
    break;
  case 0xc:
    pcVar8 = "WS: CLOSE frame must not be fragmented";
    goto LAB_00168588;
  case 0x10:
    bVar9 = 0x89;
    break;
  case 0x14:
    pcVar8 = "WS: PING frame must not be fragmented";
LAB_00168588:
    Curl_failf(data,pcVar8);
    CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_00168597:
    *err = CVar3;
    goto LAB_00168618;
  }
LAB_00168611:
  if (*err == CURLE_OK) {
    if ((flags & 3) != 0) {
      enc->field_0x19 = enc->field_0x19 & 0xfe | (byte)flags >> 2 & 1;
    }
    enc->firstbyte = bVar9;
    uVar7 = (undefined1)((ulong)payload_len >> 8);
    bVar6 = (byte)payload_len;
    if ((ulong)payload_len < 0x10000) {
      if ((ulong)payload_len < 0x7e) {
        pbVar10 = local_3e + 2;
        pbVar4 = local_3e + 1;
        bVar6 = bVar6 | 0x80;
        len = 6;
      }
      else {
        pbVar10 = local_3e + 4;
        pbVar4 = local_3e + 3;
        local_3e[1] = 0xfe;
        len = 8;
        local_3e[2] = uVar7;
      }
    }
    else {
      pbVar10 = local_34;
      pbVar4 = local_3e + 9;
      local_3e[1] = 0xff;
      local_3e[3] = (byte)((ulong)payload_len >> 0x30);
      local_3e[4] = (byte)((ulong)payload_len >> 0x28);
      local_3e[5] = (byte)((ulong)payload_len >> 0x20);
      local_3e[6] = (byte)((ulong)payload_len >> 0x18);
      local_3e[7] = (byte)((ulong)payload_len >> 0x10);
      len = 0xe;
      local_3e[2] = (char)((ulong)payload_len >> 0x38);
      local_3e[8] = uVar7;
    }
    *pbVar4 = bVar6;
    enc->payload_len = payload_len;
    enc->payload_remain = payload_len;
    local_3e[0] = bVar9;
    ws_enc_info(enc,data,"sending");
    *(undefined4 *)pbVar10 = *(undefined4 *)enc->mask;
    enc->xori = 0;
    sVar5 = Curl_bufq_write(out,local_3e,len,err);
    if (-1 < (long)sVar5) {
      if (sVar5 == len) {
        return len;
      }
LAB_0016849b:
      *err = CURLE_SEND_ERROR;
    }
  }
  else {
LAB_00168618:
    Curl_failf(data,"WS: provided flags not valid: %x",(ulong)flags);
  }
  return -1;
}

Assistant:

static ssize_t ws_enc_write_head(struct Curl_easy *data,
                                 struct ws_encoder *enc,
                                 unsigned int flags,
                                 curl_off_t payload_len,
                                 struct bufq *out,
                                 CURLcode *err)
{
  unsigned char firstbyte = 0;
  unsigned char head[14];
  size_t hlen;
  ssize_t n;

  if(payload_len < 0) {
    failf(data, "WS: starting new frame with negative payload length %"
                FMT_OFF_T, payload_len);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(enc->payload_remain > 0) {
    /* trying to write a new frame before the previous one is finished */
    failf(data, "WS: starting new frame with %zd bytes from last one "
                "remaining to be sent", (ssize_t)enc->payload_remain);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  firstbyte = ws_frame_flags2firstbyte(data, flags, enc->contfragment, err);
  if(*err) {
    failf(data, "WS: provided flags not valid: %x", flags);
    return -1;
  }

  /* fragmentation only applies to data frames (text/binary);
   * control frames (close/ping/pong) do not affect the CONT status */
  if(flags & (CURLWS_TEXT | CURLWS_BINARY)) {
    enc->contfragment = (flags & CURLWS_CONT) ? (bit)TRUE : (bit)FALSE;
  }

  head[0] = enc->firstbyte = firstbyte;
  if(payload_len > 65535) {
    head[1] = 127 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 56) & 0xff);
    head[3] = (unsigned char)((payload_len >> 48) & 0xff);
    head[4] = (unsigned char)((payload_len >> 40) & 0xff);
    head[5] = (unsigned char)((payload_len >> 32) & 0xff);
    head[6] = (unsigned char)((payload_len >> 24) & 0xff);
    head[7] = (unsigned char)((payload_len >> 16) & 0xff);
    head[8] = (unsigned char)((payload_len >> 8) & 0xff);
    head[9] = (unsigned char)(payload_len & 0xff);
    hlen = 10;
  }
  else if(payload_len >= 126) {
    head[1] = 126 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 8) & 0xff);
    head[3] = (unsigned char)(payload_len & 0xff);
    hlen = 4;
  }
  else {
    head[1] = (unsigned char)payload_len | WSBIT_MASK;
    hlen = 2;
  }

  enc->payload_remain = enc->payload_len = payload_len;
  ws_enc_info(enc, data, "sending");

  /* add 4 bytes mask */
  memcpy(&head[hlen], &enc->mask, 4);
  hlen += 4;
  /* reset for payload to come */
  enc->xori = 0;

  n = Curl_bufq_write(out, head, hlen, err);
  if(n < 0)
    return -1;
  if((size_t)n != hlen) {
    /* We use a bufq with SOFT_LIMIT, writing should always succeed */
    DEBUGASSERT(0);
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  return n;
}